

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

BufferSp __thiscall
vkt::SpirVAssembly::getSpecializedBuffer<long>(SpirVAssembly *this,deInt64 number)

{
  Buffer<long> *this_00;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar1;
  allocator<long> local_39;
  deInt64 local_38;
  vector<long,_std::allocator<long>_> local_30;
  deInt64 local_18;
  deInt64 number_local;
  
  local_18 = number;
  number_local = (deInt64)this;
  this_00 = (Buffer<long> *)operator_new(0x20);
  local_38 = local_18;
  std::allocator<long>::allocator(&local_39);
  std::vector<long,_std::allocator<long>_>::vector(&local_30,1,&local_38,&local_39);
  Buffer<long>::Buffer(this_00,&local_30);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
  std::vector<long,_std::allocator<long>_>::~vector(&local_30);
  std::allocator<long>::~allocator(&local_39);
  BVar1.m_state = extraout_RDX;
  BVar1.m_ptr = (BufferInterface *)this;
  return BVar1;
}

Assistant:

BufferSp getSpecializedBuffer (deInt64 number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, (T)number)));
}